

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  uint local_7c;
  float local_78;
  char *local_68;
  int ca;
  int cb;
  int cg;
  int cr;
  ImVec4 cf;
  ImVec2 sz;
  char *text_end;
  ImGuiContext *g;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *text_local;
  
  pIVar1 = GImGui;
  BeginTooltipEx(0,true);
  if (text == (char *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text < local_68) {
    TextEx(text,local_68,0);
    Separator();
  }
  ImVec2::ImVec2((ImVec2 *)&cf.z,pIVar1->FontSize * 3.0 + (pIVar1->Style).FramePadding.y * 2.0,
                 pIVar1->FontSize * 3.0 + (pIVar1->Style).FramePadding.y * 2.0);
  if ((flags & 2U) == 0) {
    local_78 = col[3];
  }
  else {
    local_78 = 1.0;
  }
  ImVec4::ImVec4((ImVec4 *)&cg,*col,col[1],col[2],local_78);
  fVar5 = ImSaturate(*col);
  uVar2 = (uint)(fVar5 * 255.0 + 0.5);
  fVar5 = ImSaturate(col[1]);
  uVar3 = (uint)(fVar5 * 255.0 + 0.5);
  fVar5 = ImSaturate(col[2]);
  uVar4 = (uint)(fVar5 * 255.0 + 0.5);
  if ((flags & 2U) == 0) {
    fVar5 = ImSaturate(col[3]);
    local_7c = (uint)(fVar5 * 255.0 + 0.5);
  }
  else {
    local_7c = 0xff;
  }
  ColorButton("##preview",(ImVec4 *)&cg,flags & 0x18060002U | 0x40,(ImVec2)cf._8_8_);
  SameLine(0.0,-1.0);
  if (((flags & 0x8000000U) == 0) && ((flags & 0x18000000U) != 0)) {
    if ((flags & 0x10000000U) != 0) {
      if ((flags & 2U) == 0) {
        Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f",(double)*col,(double)col[1],(double)col[2],
             (double)col[3]);
      }
      else {
        Text("H: %.3f, S: %.3f, V: %.3f",(double)*col,(double)col[1],(double)col[2]);
      }
    }
  }
  else if ((flags & 2U) == 0) {
    Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",(double)*col,
         (double)col[1],(double)col[2],(double)col[3],(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
         (ulong)local_7c,(ulong)uVar2,uVar3,uVar4,local_7c);
  }
  else {
    Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",(double)*col,(double)col[1],
         (double)col[2],(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2,(ulong)uVar3,uVar4);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(0, true);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags__InputMask))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}